

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

void __thiscall
flatbuffers::cpp::CppGenerator::GenComparatorForStruct
          (CppGenerator *this,StructDef *struct_def,size_t space_size,string *lhs_struct_literal,
          string *rhs_struct_literal)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CodeWriter *this_00;
  BaseType BVar2;
  pointer pcVar3;
  FieldDef *pFVar4;
  StructDef *pSVar5;
  CppGenerator *this_01;
  mapped_type *pmVar6;
  long *plVar7;
  size_type *psVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  char cVar11;
  pointer ppFVar12;
  string space;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string curr_field_name;
  key_type local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  size_t local_368;
  CppGenerator *local_360;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string *local_118;
  string *local_110;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  StructDef *local_88;
  size_t local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  paVar1 = &local_3e8.field_2;
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  local_368 = space_size;
  local_118 = rhs_struct_literal;
  local_110 = lhs_struct_literal;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"LHS_PREFIX","");
  this_00 = &this->code_;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_3e8);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"RHS_PREFIX","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_3e8);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_3e8,(char)local_368);
  ppFVar12 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_78 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar12 != local_78) {
    local_80 = local_368 + 2;
    local_360 = this;
    do {
      Name_abi_cxx11_(&local_c8,local_360,*ppFVar12);
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"CURR_FIELD_NAME","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_3a8);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"LHS","");
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      pcVar3 = (local_110->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,pcVar3,pcVar3 + local_110->_M_string_length);
      std::__cxx11::string::append((char *)&local_388);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_388,(ulong)local_c8._M_dataplus._M_p);
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_3c8.field_2._M_allocated_capacity = *psVar8;
        local_3c8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_3c8.field_2._M_allocated_capacity = *psVar8;
        local_3c8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_3c8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_3a8);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"RHS","");
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      pcVar3 = (local_118->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,pcVar3,pcVar3 + local_118->_M_string_length);
      std::__cxx11::string::append((char *)&local_388);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_388,(ulong)local_c8._M_dataplus._M_p);
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_3c8.field_2._M_allocated_capacity = *psVar8;
        local_3c8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_3c8.field_2._M_allocated_capacity = *psVar8;
        local_3c8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_3c8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_3a8);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      pFVar4 = *ppFVar12;
      BVar2 = (pFVar4->value).type.base_type;
      if (BVar2 == BASE_TYPE_STRUCT) {
        cVar11 = ((pFVar4->value).type.struct_def)->fixed;
      }
      else {
        cVar11 = '\0';
      }
      if (pFVar4->key == true) {
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,local_3e8._M_dataplus._M_p,
                   local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
        std::__cxx11::string::append((char *)&local_358);
        CodeWriter::operator+=(this_00,&local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,local_3e8._M_dataplus._M_p,
                   local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
        std::__cxx11::string::append((char *)&local_138);
        CodeWriter::operator+=(this_00,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_3e8._M_dataplus._M_p,
                   local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
        std::__cxx11::string::append((char *)&local_158);
        CodeWriter::operator+=(this_00,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_3e8._M_dataplus._M_p,
                   local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
        std::__cxx11::string::append((char *)&local_178);
        CodeWriter::operator+=(this_00,&local_178);
        uVar9 = local_178.field_2._M_allocated_capacity;
        _Var10._M_p = local_178._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) goto LAB_00187561;
      }
      else {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_3e8._M_dataplus._M_p,
                   local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
        std::__cxx11::string::append((char *)&local_198);
        CodeWriter::operator+=(this_00,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_3e8._M_dataplus._M_p,
                   local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
        std::__cxx11::string::append((char *)&local_1b8);
        CodeWriter::operator+=(this_00,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,local_3e8._M_dataplus._M_p,
                     local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
          std::__cxx11::string::append((char *)&local_1d8);
          CodeWriter::operator+=(this_00,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f8,local_3e8._M_dataplus._M_p,
                     local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
          std::__cxx11::string::append((char *)&local_1f8);
          CodeWriter::operator+=(this_00,&local_1f8);
          uVar9 = local_1f8.field_2._M_allocated_capacity;
          _Var10._M_p = local_1f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) goto LAB_00187561;
        }
        else if (BVar2 == BASE_TYPE_ARRAY) {
          BVar2 = ((*ppFVar12)->value).type.element;
          pSVar5 = ((*ppFVar12)->value).type.struct_def;
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,local_3e8._M_dataplus._M_p,
                     local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
          std::__cxx11::string::append((char *)&local_218);
          CodeWriter::operator+=(this_00,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,local_3e8._M_dataplus._M_p,
                     local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
          std::__cxx11::string::append((char *)&local_238);
          CodeWriter::operator+=(this_00,&local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,local_3e8._M_dataplus._M_p,
                     local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
          std::__cxx11::string::append((char *)&local_258);
          CodeWriter::operator+=(this_00,&local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_278,local_3e8._M_dataplus._M_p,
                       local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
            std::__cxx11::string::append((char *)&local_278);
            CodeWriter::operator+=(this_00,&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_298,local_3e8._M_dataplus._M_p,
                       local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
            std::__cxx11::string::append((char *)&local_298);
            CodeWriter::operator+=(this_00,&local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2b8,local_3e8._M_dataplus._M_p,
                       local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
            std::__cxx11::string::append((char *)&local_2b8);
            CodeWriter::operator+=(this_00,&local_2b8);
            uVar9 = local_2b8.field_2._M_allocated_capacity;
            _Var10._M_p = local_2b8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) goto LAB_00187561;
          }
          else if ((BVar2 == BASE_TYPE_STRUCT) && (pSVar5->fixed == true)) {
            if ((*ppFVar12)->key == true) {
              local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2d8,local_3e8._M_dataplus._M_p,
                         local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
              std::__cxx11::string::append((char *)&local_2d8);
              CodeWriter::operator+=(this_00,&local_2d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                operator_delete(local_2d8._M_dataplus._M_p,
                                local_2d8.field_2._M_allocated_capacity + 1);
              }
              local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2f8,local_3e8._M_dataplus._M_p,
                         local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
              std::__cxx11::string::append((char *)&local_2f8);
              CodeWriter::operator+=(this_00,&local_2f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                operator_delete(local_2f8._M_dataplus._M_p,
                                local_2f8.field_2._M_allocated_capacity + 1);
              }
              local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_318,local_3e8._M_dataplus._M_p,
                         local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
              std::__cxx11::string::append((char *)&local_318);
              CodeWriter::operator+=(this_00,&local_318);
              uVar9 = local_318.field_2._M_allocated_capacity;
              _Var10._M_p = local_318._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
LAB_00187561:
                operator_delete(_Var10._M_p,uVar9 + 1);
              }
            }
            else {
              local_88 = ((*ppFVar12)->value).type.struct_def;
              local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"LHS","");
              CodeWriter::GetValue(&local_3a8,this_00,&local_3c8);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a8);
              this_01 = local_360;
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              psVar8 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_e8.field_2._M_allocated_capacity = *psVar8;
                local_e8.field_2._8_4_ = (undefined4)plVar7[3];
                local_e8.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
              }
              else {
                local_e8.field_2._M_allocated_capacity = *psVar8;
                local_e8._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_e8._M_string_length = plVar7[1];
              *plVar7 = (long)psVar8;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"RHS","");
              CodeWriter::GetValue(&local_388,this_00,&local_a8);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              psVar8 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_108.field_2._M_allocated_capacity = *psVar8;
                local_108.field_2._8_8_ = plVar7[3];
              }
              else {
                local_108.field_2._M_allocated_capacity = *psVar8;
                local_108._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_108._M_string_length = plVar7[1];
              *plVar7 = (long)psVar8;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              GenComparatorForStruct(this_01,local_88,local_80,&local_e8,&local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388._M_dataplus._M_p != &local_388.field_2) {
                operator_delete(local_388._M_dataplus._M_p,
                                local_388.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                operator_delete(local_3c8._M_dataplus._M_p,
                                local_3c8.field_2._M_allocated_capacity + 1);
              }
              local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_338,local_3e8._M_dataplus._M_p,
                         local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
              std::__cxx11::string::append((char *)&local_338);
              CodeWriter::operator+=(this_00,&local_338);
              uVar9 = local_338.field_2._M_allocated_capacity;
              _Var10._M_p = local_338._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_338._M_dataplus._M_p != &local_338.field_2) goto LAB_00187561;
            }
          }
        }
        else if (cVar11 != '\0') {
          pSVar5 = ((*ppFVar12)->value).type.struct_def;
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"LHS","");
          CodeWriter::GetValue(&local_70,this_00,&local_3a8);
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"RHS","");
          CodeWriter::GetValue(&local_50,this_00,&local_3c8);
          GenComparatorForStruct(local_360,pSVar5,local_368,&local_70,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          uVar9 = local_3a8.field_2._M_allocated_capacity;
          _Var10._M_p = local_3a8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) goto LAB_00187561;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      ppFVar12 = ppFVar12 + 1;
    } while (ppFVar12 != local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenComparatorForStruct(const StructDef &struct_def, size_t space_size,
                              const std::string lhs_struct_literal,
                              const std::string rhs_struct_literal) {
    code_.SetValue("LHS_PREFIX", lhs_struct_literal);
    code_.SetValue("RHS_PREFIX", rhs_struct_literal);
    std::string space(space_size, ' ');
    for (const auto &curr_field : struct_def.fields.vec) {
      const auto curr_field_name = Name(*curr_field);
      code_.SetValue("CURR_FIELD_NAME", curr_field_name);
      code_.SetValue("LHS", lhs_struct_literal + "_" + curr_field_name);
      code_.SetValue("RHS", rhs_struct_literal + "_" + curr_field_name);
      const bool is_scalar = IsScalar(curr_field->value.type.base_type);
      const bool is_array = IsArray(curr_field->value.type);
      const bool is_struct = IsStruct(curr_field->value.type);

      // If encouter a key field, call KeyCompareWithValue to compare this
      // field.
      if (curr_field->key) {
        code_ += space +
                 "const auto {{RHS}} = {{RHS_PREFIX}}.{{CURR_FIELD_NAME}}();";
        code_ += space +
                 "const auto {{CURR_FIELD_NAME}}_compare_result = "
                 "{{LHS_PREFIX}}.KeyCompareWithValue({{RHS}});";

        code_ += space + "if ({{CURR_FIELD_NAME}}_compare_result != 0)";
        code_ += space + "  return {{CURR_FIELD_NAME}}_compare_result;";
        continue;
      }

      code_ +=
          space + "const auto {{LHS}} = {{LHS_PREFIX}}.{{CURR_FIELD_NAME}}();";
      code_ +=
          space + "const auto {{RHS}} = {{RHS_PREFIX}}.{{CURR_FIELD_NAME}}();";
      if (is_scalar) {
        code_ += space + "if ({{LHS}} != {{RHS}})";
        code_ += space +
                 "  return static_cast<int>({{LHS}} > {{RHS}}) - "
                 "static_cast<int>({{LHS}} < {{RHS}});";
      } else if (is_array) {
        const auto &elem_type = curr_field->value.type.VectorType();
        code_ +=
            space +
            "for (::flatbuffers::uoffset_t i = 0; i < {{LHS}}->size(); i++) {";
        code_ += space + "  const auto {{LHS}}_elem = {{LHS}}->Get(i);";
        code_ += space + "  const auto {{RHS}}_elem = {{RHS}}->Get(i);";
        if (IsScalar(elem_type.base_type)) {
          code_ += space + "  if ({{LHS}}_elem != {{RHS}}_elem)";
          code_ += space +
                   "    return static_cast<int>({{LHS}}_elem > {{RHS}}_elem) - "
                   "static_cast<int>({{LHS}}_elem < {{RHS}}_elem);";
          code_ += space + "}";

        } else if (IsStruct(elem_type)) {
          if (curr_field->key) {
            code_ += space +
                     "const auto {{CURR_FIELD_NAME}}_compare_result = "
                     "{{LHS_PREFIX}}.KeyCompareWithValue({{RHS}});";
            code_ += space + "if ({{CURR_FIELD_NAME}}_compare_result != 0)";
            code_ += space + "  return {{CURR_FIELD_NAME}}_compare_result;";
            continue;
          }
          GenComparatorForStruct(
              *curr_field->value.type.struct_def, space_size + 2,
              code_.GetValue("LHS") + "_elem", code_.GetValue("RHS") + "_elem");

          code_ += space + "}";
        }

      } else if (is_struct) {
        GenComparatorForStruct(*curr_field->value.type.struct_def, space_size,
                               code_.GetValue("LHS"), code_.GetValue("RHS"));
      }
    }
  }